

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O1

string * psst::util::demangle<afsm::test::connection_fsm_def::transaction::extended_query::exec>
                   (void)

{
  uint in_EAX;
  char *__ptr;
  string *in_RDI;
  int status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  __ptr = (char *)__cxa_demangle("N4afsm4test18connection_fsm_def11transaction14extended_query4execE"
                                 ,0,0);
  std::__cxx11::string::string((string *)in_RDI,__ptr,(allocator *)((long)&uStack_18 + 3));
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

::std::string
demangle()
{
    int status {0};

    /*
     * Demangle the type name if using non-portable GNU extensions.
     */
    #ifdef HAS_GNU_EXTENSIONS_
    char* ret = abi::__cxa_demangle( typeid(T).name(), nullptr, nullptr, &status );
    ::std::string res{ret};
    if(ret) free(ret);
    #else
    ::std::string res{ typeid(T).name() };
    #endif
    return res;
}